

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

void auxsetstr(lua_State *L,TValue *t,char *k)

{
  StkId pSVar1;
  int hres;
  TString *key;
  long lVar2;
  
  key = luaS_new(L,k);
  if (t->tt_ == 'E') {
    hres = luaH_psetstr((Table *)(t->value_).gc,key,(TValue *)((L->top).offset + -0x10));
    if (hres == 0) {
      lVar2 = (L->top).offset;
      if ((((*(byte *)(lVar2 + -8) & 0x40) != 0) && ((((t->value_).gc)->marked & 0x20) != 0)) &&
         ((*(byte *)(*(long *)(lVar2 + -0x10) + 9) & 0x18) != 0)) {
        luaC_barrierback_(L,(t->value_).gc);
        lVar2 = (L->top).offset;
      }
      (L->top).p = (StkId)(lVar2 + -0x10);
      return;
    }
  }
  else {
    hres = 2;
  }
  pSVar1 = (L->top).p;
  *(TString **)pSVar1 = key;
  (pSVar1->val).tt_ = key->tt | 0x40;
  pSVar1 = (L->top).p;
  (L->top).p = pSVar1 + 1;
  luaV_finishset(L,t,&pSVar1->val,&pSVar1[-1].val,hres);
  (L->top).p = (StkId)((L->top).offset + -0x20);
  return;
}

Assistant:

static void auxsetstr (lua_State *L, const TValue *t, const char *k) {
  int hres;
  TString *str = luaS_new(L, k);
  api_checkpop(L, 1);
  luaV_fastset(t, str, s2v(L->top.p - 1), hres, luaH_psetstr);
  if (hres == HOK) {
    luaV_finishfastset(L, t, s2v(L->top.p - 1));
    L->top.p--;  /* pop value */
  }
  else {
    setsvalue2s(L, L->top.p, str);  /* push 'str' (to make it a TValue) */
    api_incr_top(L);
    luaV_finishset(L, t, s2v(L->top.p - 1), s2v(L->top.p - 2), hres);
    L->top.p -= 2;  /* pop value and key */
  }
  lua_unlock(L);  /* lock done by caller */
}